

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::RALocalAllocator::makeInitialAssignment(RALocalAllocator *this)

{
  uint32_t *puVar1;
  RAWorkReg RVar2;
  uint32_t uVar3;
  FuncNode *this_00;
  RAWorkReg *workReg;
  uint uVar4;
  bool bVar5;
  RegGroup RVar6;
  uint32_t uVar7;
  uint uVar8;
  ArgPack *pAVar9;
  VirtReg *pVVar10;
  uint *puVar11;
  RAStackSlot *pRVar12;
  uint32_t valueIndex;
  size_t valueIndex_00;
  uint32_t physId;
  uint32_t argIndex;
  size_t argIndex_00;
  RegGroup group;
  RegGroup local_61;
  uint local_60;
  uint local_5c;
  RAAssignment *local_58;
  uint local_4c;
  ulong local_48;
  RARegMask *local_40;
  RABlock *local_38;
  
  this_00 = this->_pass->_func;
  local_38 = BaseRAPass::entryBlock(this->_pass);
  local_38 = local_38 + 0x78;
  local_48 = (ulong)(byte)this_00->field_0xa8;
  local_58 = &this->_curAssignment;
  local_40 = &this->_availableRegs;
  local_5c = 0;
  local_60 = 1;
  do {
    if (local_60 <= local_5c) {
      return 0;
    }
    for (argIndex_00 = 0; argIndex_00 != local_48; argIndex_00 = argIndex_00 + 1) {
      for (valueIndex_00 = 0; valueIndex_00 != 4; valueIndex_00 = valueIndex_00 + 1) {
        pAVar9 = FuncNode::argPack(this_00,argIndex_00);
        uVar4 = local_60;
        if (pAVar9->_data[valueIndex_00]._signature._bits != 0) {
          uVar3 = pAVar9->_data[valueIndex_00]._id;
          if (uVar3 - 0x100 < *(uint *)&this->_cc->field_0x1f0) {
            pVVar10 = BaseCompiler::virtRegById(this->_cc,uVar3);
            workReg = *(RAWorkReg **)(pVVar10 + 0x28);
            uVar4 = local_60;
            if (workReg != (RAWorkReg *)0x0) {
              uVar3 = *(uint32_t *)workReg;
              bVar5 = ZoneBitVector::bitAt((ZoneBitVector *)local_38,uVar3);
              uVar4 = local_60;
              if (bVar5) {
                RVar6 = (RegGroup)((uint)*(undefined4 *)(workReg + 0x20) >> 8);
                group = RVar6 & kMaxValue;
                uVar7 = RAAssignment::workToPhysId(local_58,RVar6 & kMaxValue,uVar3);
                uVar4 = local_60;
                if (uVar7 == 0xff) {
                  puVar11 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                                      (&local_40->_masks,&group);
                  local_4c = *puVar11;
                  local_61 = group;
                  puVar11 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                                      ((Array<unsigned_int,_4UL> *)
                                       (this->_curAssignment)._physToWorkMap,&local_61);
                  uVar8 = ~*puVar11 & local_4c;
                  if (local_5c == 0) {
                    RVar2 = workReg[0x4a];
                    uVar4 = 2;
                    if (((byte)RVar2 != 0xff) && ((uVar8 >> ((byte)RVar2 & 0x1f) & 1) != 0)) {
                      uVar7 = (uint32_t)(byte)RVar2;
LAB_0011cdba:
                      RAAssignment::assign(local_58,group,uVar3,uVar7,true);
                      FuncArgsAssignment::assignRegInPack
                                (&this->_pass->_argsAssignment,argIndex_00,valueIndex_00,
                                 (byte)workReg[0x20] >> 3,uVar7,
                                 *(TypeId *)(*(long *)(workReg + 8) + 0xd));
                      uVar4 = local_60;
                    }
                  }
                  else {
                    if (uVar8 != 0) {
                      uVar7 = 0;
                      if (uVar8 != 0) {
                        for (; (uVar8 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                        }
                      }
                      goto LAB_0011cdba;
                    }
                    pRVar12 = BaseRAPass::getOrCreateStackSlot(this->_pass,workReg);
                    if (pRVar12 == (RAStackSlot *)0x0) {
                      return 1;
                    }
                    workReg[0x25] = (RAWorkReg)((byte)workReg[0x25] | 4);
                    puVar1 = &this->_pass->_numStackArgsToStackSlots;
                    *puVar1 = *puVar1 + 1;
                    uVar4 = local_60;
                  }
                }
              }
            }
          }
        }
        local_60 = uVar4;
      }
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

Error RALocalAllocator::makeInitialAssignment() noexcept {
  FuncNode* func = _pass->func();
  RABlock* entry = _pass->entryBlock();

  ZoneBitVector& liveIn = entry->liveIn();
  uint32_t argCount = func->argCount();
  uint32_t numIter = 1;

  for (uint32_t iter = 0; iter < numIter; iter++) {
    for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
      for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
        // Unassigned argument.
        const RegOnly& regArg = func->argPack(argIndex)[valueIndex];
        if (!regArg.isReg() || !_cc->isVirtIdValid(regArg.id()))
          continue;

        VirtReg* virtReg = _cc->virtRegById(regArg.id());

        // Unreferenced argument.
        RAWorkReg* workReg = virtReg->workReg();
        if (!workReg)
          continue;

        // Overwritten argument.
        uint32_t workId = workReg->workId();
        if (!liveIn.bitAt(workId))
          continue;

        RegGroup group = workReg->group();
        if (_curAssignment.workToPhysId(group, workId) != RAAssignment::kPhysNone)
          continue;

        RegMask allocableRegs = _availableRegs[group] & ~_curAssignment.assigned(group);
        if (iter == 0) {
          // First iteration: Try to allocate to home RegId.
          if (workReg->hasHomeRegId()) {
            uint32_t physId = workReg->homeRegId();
            if (Support::bitTest(allocableRegs, physId)) {
              _curAssignment.assign(group, workId, physId, true);
              _pass->_argsAssignment.assignRegInPack(argIndex, valueIndex, workReg->type(), physId, workReg->typeId());
              continue;
            }
          }

          numIter = 2;
        }
        else {
          // Second iteration: Pick any other register if the is an unassigned one or assign to stack.
          if (allocableRegs) {
            uint32_t physId = Support::ctz(allocableRegs);
            _curAssignment.assign(group, workId, physId, true);
            _pass->_argsAssignment.assignRegInPack(argIndex, valueIndex, workReg->type(), physId, workReg->typeId());
          }
          else {
            // This register will definitely need stack, create the slot now and assign also `argIndex`
            // to it. We will patch `_argsAssignment` later after RAStackAllocator finishes.
            RAStackSlot* slot = _pass->getOrCreateStackSlot(workReg);
            if (ASMJIT_UNLIKELY(!slot))
              return DebugUtils::errored(kErrorOutOfMemory);

            // This means STACK_ARG may be moved to STACK.
            workReg->addFlags(RAWorkRegFlags::kStackArgToStack);
            _pass->_numStackArgsToStackSlots++;
          }
        }
      }
    }
  }

  return kErrorOk;
}